

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O2

void __thiscall
wasm::Memory64Lowering::wrapAddress64(Memory64Lowering *this,Expression **ptr,Name memoryName)

{
  Module *this_00;
  Memory *pMVar1;
  Unary *pUVar2;
  Builder local_20;
  Builder builder;
  
  if (((*ptr)->type).id != 1) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    pMVar1 = Module::getMemory(this_00,memoryName);
    if ((pMVar1->indexType).id == 3) {
      if (((*ptr)->type).id != 3) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x2b,"void wasm::Memory64Lowering::wrapAddress64(Expression *&, Name)");
      }
      local_20.wasm = this_00;
      pUVar2 = Builder::makeUnary(&local_20,WrapInt64,*ptr);
      *ptr = (Expression *)pUVar2;
    }
  }
  return;
}

Assistant:

void wrapAddress64(Expression*& ptr, Name memoryName) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    auto memory = module.getMemory(memoryName);
    if (memory->is64()) {
      assert(ptr->type == Type::i64);
      Builder builder(module);
      ptr = builder.makeUnary(UnaryOp::WrapInt64, ptr);
    }
  }